

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_gentm.cc
# Opt level: O0

int asn1_generalizedtime_to_tm(tm *tm,ASN1_GENERALIZEDTIME *d)

{
  int iVar1;
  undefined1 local_30 [8];
  CBS cbs;
  ASN1_GENERALIZEDTIME *d_local;
  tm *tm_local;
  
  if (d->type == 0x18) {
    cbs.len = (size_t)d;
    CBS_init((CBS *)local_30,d->data,(long)d->length);
    iVar1 = CBS_parse_generalized_time((CBS *)local_30,tm,0);
    if (iVar1 == 0) {
      tm_local._4_4_ = 0;
    }
    else {
      tm_local._4_4_ = 1;
    }
  }
  else {
    tm_local._4_4_ = 0;
  }
  return tm_local._4_4_;
}

Assistant:

int asn1_generalizedtime_to_tm(struct tm *tm, const ASN1_GENERALIZEDTIME *d) {
  if (d->type != V_ASN1_GENERALIZEDTIME) {
    return 0;
  }
  CBS cbs;
  CBS_init(&cbs, d->data, (size_t)d->length);
  if (!CBS_parse_generalized_time(&cbs, tm, /*allow_timezone_offset=*/0)) {
    return 0;
  }
  return 1;
}